

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngtrans.c
# Opt level: O0

void png_do_swap(png_row_infop row_info,png_bytep row)

{
  byte bVar1;
  png_byte pVar2;
  png_uint_32 pVar3;
  uint uStack_24;
  png_byte t;
  png_uint_32 istop;
  png_uint_32 i;
  png_bytep rp;
  png_bytep row_local;
  png_row_infop row_info_local;
  
  if (row_info->bit_depth == '\x10') {
    pVar3 = row_info->width;
    bVar1 = row_info->channels;
    _istop = row;
    for (uStack_24 = 0; uStack_24 < pVar3 * bVar1; uStack_24 = uStack_24 + 1) {
      pVar2 = *_istop;
      *_istop = _istop[1];
      _istop[1] = pVar2;
      _istop = _istop + 2;
    }
  }
  return;
}

Assistant:

void /* PRIVATE */
png_do_swap(png_row_infop row_info, png_bytep row)
{
   png_debug(1, "in png_do_swap");

   if (row_info->bit_depth == 16)
   {
      png_bytep rp = row;
      png_uint_32 i;
      png_uint_32 istop= row_info->width * row_info->channels;

      for (i = 0; i < istop; i++, rp += 2)
      {
#ifdef PNG_BUILTIN_BSWAP16_SUPPORTED
         /* Feature added to libpng-1.6.11 for testing purposes, not
          * enabled by default.
          */
         *(png_uint_16*)rp = __builtin_bswap16(*(png_uint_16*)rp);
#else
         png_byte t = *rp;
         *rp = *(rp + 1);
         *(rp + 1) = t;
#endif
      }
   }
}